

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PltFileManager.cpp
# Opt level: O0

void __thiscall
pele::physics::pltfilemanager::PltFileManager::readGenericPlotfileHeader
          (PltFileManager *this,string *a_pltFileHeader)

{
  undefined1 uVar1;
  bool bVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  istream *piVar5;
  Box *dom;
  int *piVar6;
  Geometry *pGVar7;
  long in_RDI;
  int lev_2;
  Array<int,_3> perio;
  int coord_sys;
  int lev_1;
  int lev;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> Domains;
  int i_2;
  istringstream lis_2;
  RealBox rb;
  int i_1;
  istringstream lis_1;
  int i;
  istringstream lis;
  Real prob_hi [3];
  Real prob_lo [3];
  int PLT_SPACEDIM;
  int n;
  string word;
  string line;
  istringstream is;
  string fileCharPtrString;
  Vector<char,_std::allocator<char>_> fileCharPtr;
  Geometry *in_stack_fffffffffffff678;
  string *in_stack_fffffffffffff680;
  undefined1 *puVar8;
  int coord;
  int in_stack_fffffffffffff690;
  undefined4 in_stack_fffffffffffff694;
  size_type in_stack_fffffffffffff698;
  Geometry *in_stack_fffffffffffff6a0;
  Box *in_stack_fffffffffffff6b8;
  undefined7 in_stack_fffffffffffff6c0;
  undefined1 local_900 [204];
  int local_834;
  undefined1 local_830 [204];
  undefined1 local_764 [12];
  int local_758;
  int local_754;
  int local_750;
  undefined1 local_749 [29];
  int local_72c;
  istringstream local_728 [80];
  MPI_Comm *in_stack_fffffffffffff928;
  undefined1 in_stack_fffffffffffff937;
  Vector<char,_std::allocator<char>_> *in_stack_fffffffffffff938;
  string *in_stack_fffffffffffff940;
  RealBox local_5a8;
  int local_574;
  istringstream local_570 [388];
  int local_3ec;
  istringstream local_3e8 [384];
  Real local_268 [4];
  Real local_248 [3];
  int local_230;
  int local_22c;
  string local_228 [32];
  string local_208 [32];
  istringstream local_1e8 [391];
  allocator local_61;
  string local_60 [52];
  MPI_Comm local_2c;
  
  amrex::Vector<char,_std::allocator<char>_>::Vector
            ((Vector<char,_std::allocator<char>_> *)0xe3db79);
  local_2c = amrex::ParallelDescriptor::Communicator();
  amrex::ParallelDescriptor::ReadAndBcastFile
            (in_stack_fffffffffffff940,in_stack_fffffffffffff938,(bool)in_stack_fffffffffffff937,
             in_stack_fffffffffffff928);
  pcVar3 = amrex::Vector<char,_std::allocator<char>_>::dataPtr
                     ((Vector<char,_std::allocator<char>_> *)0xe3dbc0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,pcVar3,&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::istringstream::istringstream(local_1e8,local_60,_S_in);
  std::__cxx11::string::string(local_208);
  std::__cxx11::string::string(local_228);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_1e8,local_208);
  *(undefined4 *)(in_RDI + 0x20) = 0;
  std::istream::operator>>(local_1e8,(int *)(in_RDI + 0x20));
  GotoNextLine((istream *)in_stack_fffffffffffff680);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
  for (local_22c = 0; local_22c < *(int *)(in_RDI + 0x20); local_22c = local_22c + 1) {
    pbVar4 = amrex::
             Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffff680,(size_type)in_stack_fffffffffffff678);
    std::operator>>((istream *)local_1e8,(string *)pbVar4);
    GotoNextLine((istream *)in_stack_fffffffffffff680);
  }
  local_230 = 3;
  std::istream::operator>>(local_1e8,&local_230);
  GotoNextLine((istream *)in_stack_fffffffffffff680);
  std::istream::operator>>(local_1e8,(double *)(in_RDI + 0x48));
  GotoNextLine((istream *)in_stack_fffffffffffff680);
  std::istream::operator>>(local_1e8,(int *)(in_RDI + 0x40));
  GotoNextLine((istream *)in_stack_fffffffffffff680);
  *(int *)(in_RDI + 0x40) = *(int *)(in_RDI + 0x40) + 1;
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::resize
            ((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)in_stack_fffffffffffff6a0,
             in_stack_fffffffffffff698);
  std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::resize
            ((vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)in_stack_fffffffffffff6a0,
             in_stack_fffffffffffff698);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff6a0,
             in_stack_fffffffffffff698);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_1e8,local_208);
  std::__cxx11::istringstream::istringstream(local_3e8,local_208,_S_in);
  local_3ec = 0;
  while( true ) {
    piVar5 = std::operator>>((istream *)local_3e8,local_228);
    uVar1 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
    if (!(bool)uVar1) break;
    in_stack_fffffffffffff6b8 =
         (Box *)std::__cxx11::stod(in_stack_fffffffffffff680,(size_t *)in_stack_fffffffffffff678);
    local_248[local_3ec] = (Real)in_stack_fffffffffffff6b8;
    local_3ec = local_3ec + 1;
  }
  std::__cxx11::istringstream::~istringstream(local_3e8);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_1e8,local_208);
  std::__cxx11::istringstream::istringstream(local_570,local_208,_S_in);
  local_574 = 0;
  while( true ) {
    piVar5 = std::operator>>((istream *)local_570,local_228);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
    if (!bVar2) break;
    in_stack_fffffffffffff6a0 =
         (Geometry *)
         std::__cxx11::stod(in_stack_fffffffffffff680,(size_t *)in_stack_fffffffffffff678);
    local_268[local_574] = (Real)in_stack_fffffffffffff6a0;
    local_574 = local_574 + 1;
  }
  std::__cxx11::istringstream::~istringstream(local_570);
  amrex::RealBox::RealBox(&local_5a8,local_248,local_268);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_1e8,local_208);
  std::__cxx11::istringstream::istringstream(local_728,local_208,_S_in);
  local_72c = 0;
  while( true ) {
    dom = (Box *)std::operator>>((istream *)local_728,local_228);
    bVar2 = std::ios::operator_cast_to_bool
                      ((ios *)((long)(dom->smallend).vect +
                              *(long *)(*(long *)(dom->smallend).vect + -0x18)));
    in_stack_fffffffffffff694 = CONCAT13(bVar2,(int3)in_stack_fffffffffffff694);
    if (!bVar2) break;
    in_stack_fffffffffffff690 =
         std::__cxx11::stoi(in_stack_fffffffffffff680,(size_t *)in_stack_fffffffffffff678,0);
    local_72c = local_72c + 1;
    piVar6 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff680,
                        (size_type)in_stack_fffffffffffff678);
    *piVar6 = in_stack_fffffffffffff690;
  }
  std::__cxx11::istringstream::~istringstream(local_728);
  piVar5 = (istream *)(long)*(int *)(in_RDI + 0x40);
  puVar8 = local_749;
  std::allocator<amrex::Box>::allocator((allocator<amrex::Box> *)0xe3e15d);
  amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>::vector
            ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)piVar5,
             (size_type)in_stack_fffffffffffff678,(allocator_type *)0xe3e174);
  std::allocator<amrex::Box>::~allocator((allocator<amrex::Box> *)0xe3e183);
  for (local_750 = 0; local_750 < *(int *)(in_RDI + 0x40); local_750 = local_750 + 1) {
    amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
              ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)piVar5,
               (size_type)in_stack_fffffffffffff678);
    amrex::operator>>((istream *)CONCAT17(uVar1,in_stack_fffffffffffff6c0),in_stack_fffffffffffff6b8
                     );
  }
  GotoNextLine(piVar5);
  GotoNextLine(piVar5);
  for (local_754 = 0; coord = (int)((ulong)puVar8 >> 0x20), local_754 < *(int *)(in_RDI + 0x40);
      local_754 = local_754 + 1) {
    GotoNextLine(piVar5);
  }
  local_758 = 0;
  std::istream::operator>>(local_1e8,&local_758);
  GotoNextLine(piVar5);
  memset(local_764,0,0xc);
  amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
            ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)piVar5,
             (size_type)in_stack_fffffffffffff678);
  amrex::Geometry::Geometry
            (in_stack_fffffffffffff6a0,dom,
             (RealBox *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),coord,
             (Array<int,_3> *)piVar5);
  pGVar7 = amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                     ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)piVar5,
                      (size_type)in_stack_fffffffffffff678);
  memcpy(pGVar7,local_830,200);
  for (local_834 = 1; local_834 < *(int *)(in_RDI + 0x40); local_834 = local_834 + 1) {
    in_stack_fffffffffffff678 =
         amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                   ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)piVar5,
                    (size_type)in_stack_fffffffffffff678);
    amrex::Vector<int,_std::allocator<int>_>::operator[]
              ((Vector<int,_std::allocator<int>_> *)piVar5,(size_type)in_stack_fffffffffffff678);
    amrex::refine(in_stack_fffffffffffff6a0,(int)((ulong)dom >> 0x20));
    pGVar7 = amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                       ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)piVar5,
                        (size_type)in_stack_fffffffffffff678);
    memcpy(pGVar7,local_900,200);
  }
  amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>::~Vector
            ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)0xe3e3e8);
  std::__cxx11::string::~string(local_228);
  std::__cxx11::string::~string(local_208);
  std::__cxx11::istringstream::~istringstream(local_1e8);
  std::__cxx11::string::~string(local_60);
  amrex::Vector<char,_std::allocator<char>_>::~Vector
            ((Vector<char,_std::allocator<char>_> *)0xe3e429);
  return;
}

Assistant:

void
PltFileManager::readGenericPlotfileHeader(const std::string& a_pltFileHeader)
{
  Vector<char> fileCharPtr;
  ParallelDescriptor::ReadAndBcastFile(a_pltFileHeader, fileCharPtr);
  std::string fileCharPtrString(fileCharPtr.dataPtr());
  std::istringstream is(fileCharPtrString, std::istringstream::in);

  std::string line, word;

  // Title line
  std::getline(is, line);

  // Number of variables
  m_nvars = 0;
  is >> m_nvars;
  GotoNextLine(is);

  // Extract variables names
  m_vars.resize(m_nvars);
  for (int n = 0; n < m_nvars; n++) {
    is >> m_vars[n];
    GotoNextLine(is);
  }

  // Get and check space dimension
  int PLT_SPACEDIM = AMREX_SPACEDIM;
  is >> PLT_SPACEDIM;
  GotoNextLine(is);
  AMREX_ASSERT(PLT_SPACEDIM == AMREX_SPACEDIM);

  // Simulation time
  is >> m_time;
  GotoNextLine(is);

  // Number of levels
  is >> m_nlevels;
  GotoNextLine(is);
  m_nlevels += 1; // Finest is stored, need to add 1

  // Setup data holders
  m_grids.resize(m_nlevels);
  m_geoms.resize(m_nlevels);
  m_refRatio.resize(m_nlevels - 1);

  // Level 0 geometry
  Real prob_lo[AMREX_SPACEDIM];
  Real prob_hi[AMREX_SPACEDIM];
  // Low coordinates of domain bounding box
  std::getline(is, line);
  {
    std::istringstream lis(line);
    int i = 0;
    while (lis >> word) {
      prob_lo[i++] = std::stod(word);
    }
  }

  // High coordinates of domain bounding box
  std::getline(is, line);
  {
    std::istringstream lis(line);
    int i = 0;
    while (lis >> word) {
      prob_hi[i++] = std::stod(word);
    }
  }

  // Set up PltFile domain real box
  RealBox rb(prob_lo, prob_hi);

  std::getline(is, line);
  {
    std::istringstream lis(line);
    int i = 0;
    while (lis >> word) {
      m_refRatio[i++] = std::stoi(word);
    }
  }

  // Get levels Domains
  Vector<Box> Domains(m_nlevels);
  for (int lev = 0; lev < m_nlevels; ++lev) {
    is >> Domains[lev];
  }
  GotoNextLine(is);
  GotoNextLine(is); // Skip nsteps line
  for (int lev = 0; lev < m_nlevels; ++lev) {
    GotoNextLine(is); // Skip dx line
  }

  // Coordinate system
  int coord_sys = 0;
  is >> coord_sys;
  GotoNextLine(is);

  // Populate the geometry vector, assume no periodicity
  Array<int, AMREX_SPACEDIM> perio({AMREX_D_DECL(0, 0, 0)});
  m_geoms[0] = Geometry(Domains[0], rb, coord_sys, perio);
  for (int lev = 1; lev < m_nlevels; ++lev) {
    m_geoms[lev] = refine(m_geoms[lev - 1], m_refRatio[lev - 1]);
  }
}